

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O2

int sat_solver3_propagate(sat_solver3 *s)

{
  ABC_INT64_T *pAVar1;
  uint *puVar2;
  uint uVar3;
  clause cVar4;
  veci *pvVar5;
  int iVar6;
  uint uVar7;
  clause *pcVar8;
  clause cVar9;
  clause *pcVar10;
  clause cVar11;
  uint *puVar12;
  ulong uVar13;
  uint *puVar14;
  uint uVar15;
  uint *puVar16;
  uint *puVar17;
  
  uVar15 = 0;
LAB_00717cd0:
  if (uVar15 == 0) {
    iVar6 = s->qhead;
    if (iVar6 < s->qtail) {
      pvVar5 = s->wlists;
      s->qhead = iVar6 + 1;
      uVar3 = s->trail[iVar6];
      puVar12 = (uint *)pvVar5[(int)uVar3].ptr;
      puVar2 = puVar12 + pvVar5[(int)uVar3].size;
      pAVar1 = &(s->stats).propagations;
      *pAVar1 = *pAVar1 + 1;
      cVar11 = (clause)(uVar3 ^ 1);
      uVar15 = 0;
      puVar14 = puVar12;
      puVar17 = puVar12;
      puVar16 = puVar12;
LAB_00717d41:
      do {
        puVar16 = puVar16 + 1;
        if (puVar2 <= puVar14) goto LAB_00717f1b;
        uVar7 = *puVar14;
        if ((uVar7 & 1) == 0) {
          pcVar8 = Sat_MemClauseHand(&s->Mem,uVar7);
          cVar9 = pcVar8[1];
          cVar4 = pcVar8[2];
          if (cVar9 == cVar11) {
            pcVar8[1] = cVar4;
            pcVar8[2] = cVar11;
            cVar9 = cVar4;
          }
          else if (cVar4 != cVar11) {
            __assert_fail("lits[1] == false_lit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver3.c"
                          ,0x427,"int sat_solver3_propagate(sat_solver3 *)");
          }
          if (((uint)cVar9 & 1) == (int)s->assigns[(int)cVar9 >> 1]) {
            *puVar17 = *puVar14;
            puVar12 = puVar17 + 1;
          }
          else {
            for (pcVar10 = pcVar8 + 3; pcVar10 < pcVar8 + 1 + ((uint)*pcVar8 >> 0xb);
                pcVar10 = pcVar10 + 1) {
              cVar9 = *pcVar10;
              if (((uint)cVar9 & 1 ^ (int)s->assigns[(int)cVar9 >> 1]) != 1) {
                pcVar8[2] = cVar9;
                *pcVar10 = cVar11;
                veci_push(s->wlists + ((long)(int)pcVar8[2] ^ 1),*puVar14);
                puVar12 = puVar17;
                goto LAB_00717f12;
              }
            }
            uVar7 = *puVar14;
            *puVar17 = uVar7;
            cVar9 = *pcVar8;
            if (((uint)cVar9 & 1) != 0) {
              uVar7 = sat_clause_compute_lbd(s,pcVar8);
              *pcVar8 = (clause)(((uint)cVar9 & 0xfffff807) + (uVar7 & 0xff) * 8);
              uVar7 = *puVar14;
            }
            puVar12 = puVar17 + 1;
            iVar6 = sat_solver3_enqueue(s,(lit)pcVar8[1],uVar7);
            if (iVar6 == 0) {
              uVar15 = *puVar14;
              for (puVar14 = puVar16; puVar14 < puVar2; puVar14 = puVar14 + 1) {
                *puVar12 = *puVar14;
                puVar12 = puVar12 + 1;
              }
            }
          }
        }
        else {
          if ((uVar7 >> 1 & 1) == (int)s->assigns[(int)uVar7 >> 2]) {
            *puVar17 = uVar7;
            puVar12 = puVar12 + 1;
            puVar14 = puVar14 + 1;
            puVar17 = puVar17 + 1;
            goto LAB_00717d41;
          }
          *puVar17 = uVar7;
          puVar12 = puVar17 + 1;
          iVar6 = sat_solver3_enqueue(s,(int)*puVar14 >> 1,uVar3 * 2 + 1);
          if (iVar6 == 0) {
            uVar15 = s->hBinary;
            pcVar8 = s->binary;
            pcVar8[2] = cVar11;
            pcVar8[1] = (clause)((int)*puVar14 >> 1);
            for (puVar14 = puVar16; puVar14 < puVar2; puVar14 = puVar14 + 1) {
              *puVar12 = *puVar14;
              puVar12 = puVar12 + 1;
            }
          }
        }
LAB_00717f12:
        puVar14 = puVar14 + 1;
        puVar17 = puVar12;
        puVar16 = puVar14;
      } while( true );
    }
  }
  return uVar15;
LAB_00717f1b:
  uVar13 = (long)puVar12 - (long)pvVar5[(int)uVar3].ptr;
  pAVar1 = &(s->stats).inspects;
  *pAVar1 = *pAVar1 + ((long)uVar13 >> 2);
  veci_resize(pvVar5 + (int)uVar3,(int)(uVar13 >> 2));
  goto LAB_00717cd0;
}

Assistant:

int sat_solver3_propagate(sat_solver3* s)
{
    int     hConfl = 0;
    lit*    lits;
    lit false_lit;

    //printf("sat_solver3_propagate\n");
    while (hConfl == 0 && s->qtail - s->qhead > 0){
        lit p = s->trail[s->qhead++];

#ifdef TEST_CNF_LOAD
        int v = lit_var(p);
        if ( s->pCnfFunc )
        {
            if ( lit_sign(p) )
            {
                if ( (s->loads[v] & 1) == 0 )
                {
                    s->loads[v] ^= 1;
                    s->pCnfFunc( s->pCnfMan, p );
                }
            }
            else
            {
                if ( (s->loads[v] & 2) == 0 )
                {
                    s->loads[v] ^= 2;
                    s->pCnfFunc( s->pCnfMan, p );
                }
            }
        }
        {
#endif

        veci* ws    = sat_solver3_read_wlist(s,p);
        int*  begin = veci_begin(ws);
        int*  end   = begin + veci_size(ws);
        int*i, *j;

        s->stats.propagations++;
//        s->simpdb_props--;

        //printf("checking lit %d: "L_LIT"\n", veci_size(ws), L_lit(p));
        for (i = j = begin; i < end; ){
            if (clause_is_lit(*i)){

                int Lit = clause_read_lit(*i);
                if (var_value(s, lit_var(Lit)) == lit_sign(Lit)){
                    *j++ = *i++;
                    continue;
                }

                *j++ = *i;
                if (!sat_solver3_enqueue(s,clause_read_lit(*i),clause_from_lit(p))){
                    hConfl = s->hBinary;
                    (clause_begin(s->binary))[1] = lit_neg(p);
                    (clause_begin(s->binary))[0] = clause_read_lit(*i++);
                    // Copy the remaining watches:
                    while (i < end)
                        *j++ = *i++;
                }
            }else{

                clause* c = clause_read(s,*i);
                lits = clause_begin(c);

                // Make sure the false literal is data[1]:
                false_lit = lit_neg(p);
                if (lits[0] == false_lit){
                    lits[0] = lits[1];
                    lits[1] = false_lit;
                }
                assert(lits[1] == false_lit);

                // If 0th watch is true, then clause is already satisfied.
                if (var_value(s, lit_var(lits[0])) == lit_sign(lits[0]))
                    *j++ = *i;
                else{
                    // Look for new watch:
                    lit* stop = lits + clause_size(c);
                    lit* k;
                    for (k = lits + 2; k < stop; k++){
                        if (var_value(s, lit_var(*k)) != !lit_sign(*k)){
                            lits[1] = *k;
                            *k = false_lit;
                            veci_push(sat_solver3_read_wlist(s,lit_neg(lits[1])),*i);
                            goto next; }
                    }

                    *j++ = *i;
                    // Clause is unit under assignment:
                    if ( c->lrn )
                        c->lbd = sat_clause_compute_lbd(s, c);
                    if (!sat_solver3_enqueue(s,lits[0], *i)){
                        hConfl = *i++;
                        // Copy the remaining watches:
                        while (i < end)
                            *j++ = *i++;
                    }
                }
            }
        next:
            i++;
        }

        s->stats.inspects += j - veci_begin(ws);
        veci_resize(ws,j - veci_begin(ws));
#ifdef TEST_CNF_LOAD
        }
#endif
    }

    return hConfl;
}